

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimeGenerator.cpp
# Opt level: O3

int __thiscall primesieve::PrimeGenerator::init(PrimeGenerator *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  int extraout_EAX;
  ulong uVar2;
  size_type __n;
  ulong uVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar2 = (this->super_Erat).stop_;
  lVar4 = uVar2 - (this->super_Erat).start_;
  if (uVar2 < (this->super_Erat).start_) {
    __n = 0;
  }
  else {
    __n = 4;
    if (10 < uVar2) {
      auVar6._8_4_ = (int)(uVar2 >> 0x20);
      auVar6._0_8_ = uVar2;
      auVar6._12_4_ = 0x45300000;
      dVar5 = log((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
      auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar7._0_8_ = lVar4;
      auVar7._12_4_ = 0x45300000;
      dVar5 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / (dVar5 + -1.1) + 5.0
      ;
      uVar2 = (ulong)dVar5;
      __n = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ctx,__n);
  uVar2 = (this->super_Erat).start_;
  if (uVar2 < 0x2d0) {
    if (uVar2 < 2) {
      uVar2 = 0;
    }
    else {
      uVar2 = (ulong)(byte)(anonymous_namespace)::smallPrimes[uVar2 + 0x3ff];
    }
    uVar1 = (this->super_Erat).stop_;
    uVar3 = 0x80;
    if (uVar1 < 0x2cf) {
      uVar3 = (ulong)(byte)(anonymous_namespace)::primePi[uVar1];
    }
    std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_range_insert<unsigned_long_const*>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)ctx,*(undefined8 *)(ctx + 8),
               (anonymous_namespace)::smallPrimes + uVar2 * 8,
               (anonymous_namespace)::smallPrimes + uVar3 * 8);
  }
  initErat(this);
  return extraout_EAX;
}

Assistant:

void PrimeGenerator::init(vector<uint64_t>& primes)
{
  size_t size = primeCountApprox(start_, stop_);
  primes.reserve(size);

  if (start_ <= maxCachedPrime())
  {
    size_t a = getStartIdx();
    size_t b = getStopIdx();

    primes.insert(primes.end(),
             smallPrimes.begin() + a,
             smallPrimes.begin() + b);
  }

  initErat();
}